

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenTypeName_ObjectAPI
          (string *__return_storage_ptr__,CSharpGenerator *this,string *name,IDLOptions *opts)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator+(&bStack_38,&opts->object_prefix,name);
  std::operator+(__return_storage_ptr__,&bStack_38,&opts->object_suffix);
  std::__cxx11::string::~string((string *)&bStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeName_ObjectAPI(const std::string &name,
                                    const IDLOptions &opts) const {
    return opts.object_prefix + name + opts.object_suffix;
  }